

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::RequiresError::~RequiresError(RequiresError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_0018c1c8;
  pcVar2 = (this->super_ParseError).super_Error.error_name._M_dataplus._M_p;
  paVar1 = &(this->super_ParseError).super_Error.error_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}